

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O3

void __thiscall
chrono::ChFunctorArchiveInSpecific<chrono::ChCoordsys<double>_>::CallConstructor
          (ChFunctorArchiveInSpecific<chrono::ChCoordsys<double>_> *this,ChArchiveIn *marchive,
          char *classname)

{
  ChExceptionArchive *this_00;
  string local_40;
  
  this_00 = (ChExceptionArchive *)__cxa_allocate_exception(0x28);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Cannot call CallConstructor() for a constructed object.","");
  ChExceptionArchive::ChExceptionArchive(this_00,&local_40);
  __cxa_throw(this_00,&ChExceptionArchive::typeinfo,ChException::~ChException);
}

Assistant:

virtual void CallConstructor(ChArchiveIn& marchive, const char* classname) 
        { throw (ChExceptionArchive( "Cannot call CallConstructor() for a constructed object.")); }